

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escaping.cc
# Opt level: O1

bool __thiscall
absl::lts_20250127::HexStringToBytes
          (lts_20250127 *this,string_view hex,Nonnull<std::string_*> bytes)

{
  string *this_00;
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  bool bVar4;
  string output;
  char *local_58;
  long local_50;
  char local_48;
  undefined7 uStack_47;
  string *local_38;
  
  this_00 = (string *)hex._M_str;
  pcVar3 = (char *)hex._M_len;
  local_58 = &local_48;
  local_50 = 0;
  local_48 = '\0';
  if (((ulong)this & 1) == 0) {
    std::__cxx11::string::resize((ulong)&local_58,(char)((ulong)this >> 1));
    bVar4 = local_50 == 0;
    pcVar2 = local_58;
    pcVar1 = local_58;
    while (local_38 = this_00, !bVar4) {
      if ((anonymous_namespace)::kHexValueStrict[pcVar3[1]] == -1 ||
          (anonymous_namespace)::kHexValueStrict[*pcVar3] == -1) {
        std::__cxx11::string::resize((ulong)&local_58,(char)pcVar1 - (char)local_58);
        goto LAB_0023c7f8;
      }
      *pcVar2 = (anonymous_namespace)::kHexValueStrict[pcVar3[1]] +
                (anonymous_namespace)::kHexValueStrict[*pcVar3] * '\x10';
      pcVar2 = pcVar2 + 1;
      pcVar1 = pcVar1 + 1;
      pcVar3 = pcVar3 + 2;
      bVar4 = pcVar2 == local_58 + local_50;
    }
    std::__cxx11::string::operator=(this_00,(string *)&local_58);
  }
  else {
    bVar4 = false;
  }
LAB_0023c7f8:
  if (local_58 != &local_48) {
    operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
  }
  return bVar4;
}

Assistant:

bool HexStringToBytes(absl::string_view hex,
                      absl::Nonnull<std::string*> bytes) {
  std::string output;

  size_t num_bytes = hex.size() / 2;
  if (hex.size() != num_bytes * 2) {
    return false;
  }

  absl::strings_internal::STLStringResizeUninitialized(&output, num_bytes);
  auto hex_p = hex.cbegin();
  for (std::string::iterator bin_p = output.begin(); bin_p != output.end();
       ++bin_p) {
    int h1 = absl::kHexValueStrict[static_cast<size_t>(*hex_p++)];
    int h2 = absl::kHexValueStrict[static_cast<size_t>(*hex_p++)];
    if (h1 == -1 || h2 == -1) {
      output.resize(static_cast<size_t>(bin_p - output.begin()));
      return false;
    }
    *bin_p = static_cast<char>((h1 << 4) + h2);
  }

  *bytes = std::move(output);
  return true;
}